

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstEvaluateVisitor.cpp
# Opt level: O2

int calculate(int left,int right,TOperationType type)

{
  uint __line;
  int iVar1;
  undefined7 in_register_00000011;
  char *__assertion;
  
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    iVar1 = right + left;
    break;
  case 1:
    iVar1 = left - right;
    break;
  case 2:
    iVar1 = right * left;
    break;
  case 3:
    if (right == 0) {
      __assertion = "right != 0";
      __line = 0x13;
      goto LAB_001347e2;
    }
    iVar1 = left % right;
    break;
  default:
    __assertion = "false";
    __line = 0x16;
LAB_001347e2:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/ConstEvaluateVisitor.cpp"
                  ,__line,"int calculate(int, int, IRT::enums::TOperationType)");
  }
  return iVar1;
}

Assistant:

int calculate(int left, int right, IRT::enums::TOperationType type) {
    switch (type) {
        case IRT::enums::TOperationType::PLUS:
            return left + right;
        case IRT::enums::TOperationType::MINUS:
            return left - right;
        case IRT::enums::TOperationType::MULTYPLY:
            return left * right;
        case IRT::enums::TOperationType::MOD:
            assert(right != 0);
            return left % right;
        default:
            assert(false);
    }
}